

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void google::protobuf::internal::PackedFieldHelper<3>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  long *ptr;
  uint uVar4;
  uint uVar5;
  RepeatedField<long> *array;
  int index;
  
  if (*field != 0) {
    uVar4 = md->tag;
    pbVar2 = output->ptr;
    if (uVar4 < 0x80) {
      *pbVar2 = (byte)uVar4;
      pbVar2 = pbVar2 + 1;
    }
    else {
      *pbVar2 = (byte)uVar4 | 0x80;
      if (uVar4 < 0x4000) {
        pbVar2[1] = (byte)(uVar4 >> 7);
        pbVar2 = pbVar2 + 2;
      }
      else {
        pbVar2 = pbVar2 + 2;
        uVar4 = uVar4 >> 7;
        do {
          pbVar3 = pbVar2;
          pbVar3[-1] = (byte)uVar4 | 0x80;
          uVar5 = uVar4 >> 7;
          pbVar2 = pbVar3 + 1;
          bVar1 = 0x3fff < uVar4;
          uVar4 = uVar5;
        } while (bVar1);
        *pbVar3 = (byte)uVar5;
      }
    }
    output->ptr = pbVar2;
    uVar4 = *(uint *)((long)field + 0x10);
    if (uVar4 < 0x80) {
      *pbVar2 = (byte)uVar4;
      pbVar2 = pbVar2 + 1;
    }
    else {
      *pbVar2 = (byte)uVar4 | 0x80;
      if (uVar4 < 0x4000) {
        pbVar2[1] = (byte)(uVar4 >> 7);
        pbVar2 = pbVar2 + 2;
      }
      else {
        pbVar2 = pbVar2 + 2;
        uVar4 = uVar4 >> 7;
        do {
          pbVar3 = pbVar2;
          pbVar3[-1] = (byte)uVar4 | 0x80;
          uVar5 = uVar4 >> 7;
          pbVar2 = pbVar3 + 1;
          bVar1 = 0x3fff < uVar4;
          uVar4 = uVar5;
        } while (bVar1);
        *pbVar3 = (byte)uVar5;
      }
    }
    output->ptr = pbVar2;
    if (0 < *field) {
      index = 0;
      do {
        ptr = RepeatedField<long>::Get((RepeatedField<long> *)field,index);
        OutputHelper<google::protobuf::internal::ArrayOutput,_3>::Serialize(ptr,output);
        index = index + 1;
      } while (index < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}